

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O3

string * anon_unknown.dwarf_1101f3::getString(string *__return_storage_ptr__,string *filename)

{
  istream iVar1;
  string *psVar2;
  istream *piVar3;
  ifstream file;
  char *local_240;
  size_type local_238;
  char local_230;
  undefined7 uStack_22f;
  undefined8 uStack_228;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_in);
  local_238 = 0;
  local_230 = '\0';
  local_240 = &local_230;
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    piVar3 = std::operator>>((istream *)local_220,(string *)&local_240);
    iVar1 = piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (((byte)iVar1 & 5) == 0) {
      if (local_240 == &local_230) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_22f,local_230);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_228;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_240;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_22f,local_230);
      }
      __return_storage_ptr__->_M_string_length = local_238;
    }
    else {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (local_240 != &local_230) {
        operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  psVar2 = (string *)std::ifstream::~ifstream(local_220);
  return psVar2;
}

Assistant:

string getString(const string& filename)
{
  ifstream file(filename);
  string str;

  // Read the first string,
  // stops at any space character
  if (file && (file >> str))
    return str;
  else
    return {};
}